

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O2

int Min_EsopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Min_Cube_t **ppMVar6;
  ulong uVar7;
  Min_Cube_t *pMVar8;
  ulong uVar9;
  Min_Cube_t *pMVar10;
  
  ppMVar6 = p->ppStore;
  uVar3 = *(uint *)&pCube->field_0x8;
  uVar7 = (ulong)(uVar3 >> 0x16);
  pMVar10 = (Min_Cube_t *)(ppMVar6 + uVar7);
  while (pMVar8 = pMVar10, pMVar10 = pMVar8->pNext, pMVar10 != (Min_Cube_t *)0x0) {
    uVar9 = 0;
    do {
      if ((uVar3 >> 10 & 0xfff) == uVar9) {
        pMVar8->pNext = pMVar10->pNext;
        Min_CubeRecycle(p,pCube);
        Min_CubeRecycle(p,pMVar10);
        iVar5 = 0;
        goto LAB_003433c8;
      }
      puVar1 = pCube->uData + uVar9;
      puVar2 = pMVar10->uData + uVar9;
      uVar9 = uVar9 + 1;
    } while (*puVar1 == *puVar2);
  }
  if (uVar3 >> 0x16 < (uVar3 & 0x3ff)) {
    pMVar10 = (Min_Cube_t *)&((Min_Cube_t *)(ppMVar6 + uVar7))->field_0x8;
    do {
      pMVar8 = pMVar10;
      pMVar10 = pMVar8->pNext;
      if (pMVar10 == (Min_Cube_t *)0x0) {
        ppMVar6 = p->ppStore;
        uVar7 = (ulong)(*(uint *)&pCube->field_0x8 >> 0x16);
        goto LAB_00343434;
      }
      iVar5 = Min_CubesDistOne(pCube,pMVar10,p->pTemp);
    } while (iVar5 == 0);
    pMVar8->pNext = pMVar10->pNext;
    Min_CubesTransform(pCube,pMVar10,p->pTemp);
    *(int *)&pCube->field_0x8 = *(int *)&pCube->field_0x8 + 0x400000;
  }
  else {
LAB_00343434:
    pMVar10 = (Min_Cube_t *)(ppMVar6 + uVar7);
    do {
      pMVar8 = pMVar10;
      pMVar10 = pMVar8->pNext;
      if (pMVar10 == (Min_Cube_t *)0x0) {
        uVar7 = (ulong)*(uint *)&pCube->field_0x8;
        ppMVar6 = p->ppStore;
        if (uVar7 < 0x400000) goto LAB_003434e0;
        pMVar10 = (Min_Cube_t *)(ppMVar6 + ((ulong)(*(uint *)&pCube->field_0x8 >> 0x16) - 1));
        goto LAB_00343491;
      }
      iVar5 = Min_CubesDistOne(pCube,pMVar10,p->pTemp);
    } while (iVar5 == 0);
    pMVar8->pNext = pMVar10->pNext;
    Min_CubesTransform(pCube,pMVar10,p->pTemp);
    *(int *)&pCube->field_0x8 = *(int *)&pCube->field_0x8 + -0x400000;
  }
  goto LAB_003434c5;
  while (iVar5 = Min_CubesDistOne(pCube,pMVar10,p->pTemp), iVar5 == 0) {
LAB_00343491:
    pMVar8 = pMVar10;
    pMVar10 = pMVar8->pNext;
    if (pMVar10 == (Min_Cube_t *)0x0) {
      ppMVar6 = p->ppStore;
      uVar7 = (ulong)*(uint *)&pCube->field_0x8;
LAB_003434e0:
      pCube->pNext = ppMVar6[uVar7 >> 0x16];
      ppMVar6[uVar7 >> 0x16] = pCube;
      iVar5 = 0;
      iVar4 = 1;
      goto LAB_003433ca;
    }
  }
  pMVar8->pNext = pMVar10->pNext;
  Min_CubesTransform(pCube,pMVar10,p->pTemp);
LAB_003434c5:
  Min_CubeRecycle(p,pMVar10);
  iVar5 = 1;
LAB_003433c8:
  iVar4 = -1;
LAB_003433ca:
  p->nCubes = p->nCubes + iVar4;
  return iVar5;
}

Assistant:

int Min_EsopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, ** ppPrev;
    // try to find the identical cube
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubeRecycle( p, pCube );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 0;
        }
    }
    // find a distance-1 cube if it exists
    if ( pCube->nLits < pCube->nVars )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits+1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits++;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    if ( pCube->nLits > 0 )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits-1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}